

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  byte bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  string local_40;
  
  switch(other) {
  case nullValue:
    if ((ushort)((byte)this->field_0x8 - 1) < 3) {
      dVar6 = asDouble(this);
      if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_0051d6fd;
LAB_0051d710:
      bVar4 = true;
      bVar5 = false;
    }
    else {
LAB_0051d6fd:
      bVar4 = true;
      if ((this->field_0x8 == '\x05') && ((this->value_).bool_ == false)) goto LAB_0051d710;
      bVar5 = this->field_0x8 == '\x04';
      if ((bVar5) && (asString_abi_cxx11_(&local_40,this), local_40._M_string_length == 0)) {
        bVar5 = true;
        bVar4 = true;
      }
      else {
        cVar2 = (char)*(ushort *)&this->field_0x8;
        uVar3 = *(ushort *)&this->field_0x8 & 0xff;
        if (cVar2 == '\a') {
LAB_0051d756:
          if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
          goto LAB_0051d771;
        }
        else if (cVar2 == '\x06') {
          if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
          goto LAB_0051d771;
          if (uVar3 == 7) goto LAB_0051d756;
        }
        bVar4 = uVar3 == 0;
      }
    }
LAB_0051d771:
    if ((bVar5) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2)) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0051d6ed;
  case intValue:
    bVar5 = isInt(this);
    bVar4 = 1;
    if (bVar5) goto LAB_0051d6ed;
    bVar1 = this->field_0x8;
    if ((bVar1 == 3) && (dVar6 = (this->value_).real_, -2147483648.0 <= dVar6)) {
      dVar7 = 2147483647.0;
LAB_0051d6a3:
      bVar4 = 1;
      if (dVar6 <= dVar7) goto LAB_0051d6ed;
    }
    goto LAB_0051d6a9;
  case uintValue:
    bVar5 = isUInt(this);
    bVar4 = 1;
    if (bVar5) goto LAB_0051d6ed;
    bVar1 = this->field_0x8;
    if ((bVar1 == 3) && (dVar6 = (this->value_).real_, 0.0 <= dVar6)) {
      dVar7 = 4294967295.0;
      goto LAB_0051d6a3;
    }
LAB_0051d6a9:
    bVar5 = bVar1 == 5;
    break;
  case realValue:
  case booleanValue:
    bVar1 = this->field_0x8;
    bVar4 = 1;
    if ((ushort)(bVar1 - 1) < 3) goto LAB_0051d6ed;
    bVar5 = bVar1 == 5;
    break;
  case stringValue:
    bVar1 = this->field_0x8;
    bVar4 = 1;
    if (2 < (ushort)(bVar1 - 1)) {
      if (bVar1 < 6) {
        bVar4 = 0x31 >> (bVar1 & 0x1f);
      }
      else {
        bVar4 = 0;
      }
    }
    goto LAB_0051d6ed;
  case arrayValue:
    bVar1 = this->field_0x8;
    bVar5 = bVar1 == 6;
    break;
  case objectValue:
    bVar1 = this->field_0x8;
    bVar5 = bVar1 == 7;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x3a2,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  bVar4 = bVar1 == 0 | bVar5;
LAB_0051d6ed:
  return (bool)(bVar4 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString().empty()) ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}